

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v3::load_skeletonx_pm(xr_ogf_v3 *this,xr_reader *r)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  size_t sVar3;
  
  sVar3 = xr_reader::find_chunk(r,7);
  if (sVar3 == 0) {
    __assert_fail("r.find_chunk(OGF3_VERTICES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x3ca,"void xray_re::xr_ogf_v3::load_skeletonx(xr_reader &)");
  }
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar1 = *puVar2;
  if ((uVar1 != 0x12071980) && (uVar1 != 0x240e3300)) {
    __assert_fail("format == OGF3_VERTEXFORMAT_FVF_1L || format == OGF3_VERTEXFORMAT_FVF_2L",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x3cc,"void xray_re::xr_ogf_v3::load_skeletonx(xr_reader &)");
  }
  load_progressive_fixed_visual(this,r);
  return;
}

Assistant:

void xr_ogf_v3::load_skeletonx_pm(xr_reader& r)
{
	load_skeletonx(r);
	load_progressive_fixed_visual(r);
}